

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O3

ze_image_format_type_t to_format_type(string *format_type)

{
  int iVar1;
  ze_image_format_type_t zVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)format_type);
  if (iVar1 == 0) {
    zVar2 = ZE_IMAGE_FORMAT_TYPE_UINT;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)format_type);
    if (iVar1 == 0) {
      zVar2 = ZE_IMAGE_FORMAT_TYPE_SINT;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)format_type);
      if (iVar1 == 0) {
        zVar2 = ZE_IMAGE_FORMAT_TYPE_UNORM;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)format_type);
        if (iVar1 == 0) {
          zVar2 = ZE_IMAGE_FORMAT_TYPE_SNORM;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)format_type);
          if (iVar1 == 0) {
            zVar2 = ZE_IMAGE_FORMAT_TYPE_FLOAT;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Unknown ze_image_format_type_t value: ",0x26);
            zVar2 = ~ZE_IMAGE_FORMAT_TYPE_UINT;
          }
        }
      }
    }
  }
  return zVar2;
}

Assistant:

ze_image_format_type_t to_format_type(const std::string format_type) {
  if (format_type == "UINT") {
    return ZE_IMAGE_FORMAT_TYPE_UINT;
  } else if (format_type == "SINT") {
    return ZE_IMAGE_FORMAT_TYPE_SINT;
  } else if (format_type == "UNORM") {
    return ZE_IMAGE_FORMAT_TYPE_UNORM;
  } else if (format_type == "SNORM") {
    return ZE_IMAGE_FORMAT_TYPE_SNORM;
  } else if (format_type == "FLOAT") {
    return ZE_IMAGE_FORMAT_TYPE_FLOAT;
  } else {
    std::cout << "Unknown ze_image_format_type_t value: ";
    return (static_cast<ze_image_format_type_t>(-1));
  }
}